

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O2

bool Rml::ElementUtilities::GetClippingRegion
               (Element *element,Rectanglei *out_clip_region,
               ClipMaskGeometryList *out_clip_mask_list,bool force_clip_self)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  byte bVar5;
  pointer pCVar6;
  pointer pCVar7;
  CommonValues CVar8;
  ClipMaskGeometryList *this;
  uint uVar9;
  ComputedValues *pCVar10;
  Element *this_00;
  TransformState *this_01;
  Matrix4f *pMVar11;
  ElementBackgroundBorder *this_02;
  bool bVar12;
  undefined4 uVar13;
  uint uVar14;
  undefined7 uVar17;
  ulong uVar15;
  undefined8 uVar16;
  undefined8 extraout_RDX;
  ulong uVar18;
  uint uVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  byte bVar24;
  Rectangle<int> RVar25;
  BoxArea local_bc;
  Rectangle<float> local_a8;
  Vector2<float> local_98;
  Matrix4f *local_88;
  ClipMaskGeometryList *local_80;
  Rectanglei *local_78;
  Vector2Type local_70;
  Element *local_68;
  Rectanglef element_region;
  
  local_80 = out_clip_mask_list;
  pCVar10 = Element::GetComputedValues(element);
  bVar5 = (pCVar10->rare).clip.value;
  bVar24 = 0;
  if (bVar5 != 0xff || force_clip_self) {
    uVar16 = 0;
    uVar19 = 0;
    if ('\0' < (char)bVar5) {
      uVar19 = (uint)bVar5;
    }
    this_00 = element;
    local_78 = out_clip_region;
    if (!force_clip_self) {
      this_00 = Element::GetOffsetParent(element);
    }
    local_a8 = (Rectangle<float>)(ZEXT816(0xbf800000bf800000) << 0x40);
    local_68 = element;
    for (; this_00 != (Element *)0x0; this_00 = Element::GetOffsetParent(this_00)) {
      bVar20 = this_00 == local_68;
      pCVar10 = Element::GetComputedValues(this_00);
      CVar8 = pCVar10->common;
      bVar5 = (pCVar10->rare).clip.value;
      uVar9 = (uint)bVar5;
      uVar17 = (undefined7)((ulong)uVar16 >> 8);
      if (bVar5 == 0) {
        uVar18 = 0;
LAB_00298e2b:
        bVar12 = uVar19 == 0 &&
                 ((undefined1  [96])CVar8 & (undefined1  [96])0x3c00) != (undefined1  [96])0x0 ||
                 bVar20 && force_clip_self;
        uVar15 = CONCAT71(uVar17,bVar12);
        if (bVar12) {
          bVar12 = false;
LAB_00298e46:
          if (bVar20 && force_clip_self) {
            bVar20 = false;
            local_bc = Border;
          }
          else {
            uVar18 = uVar18 & 0xffffffff;
            local_bc = Element::GetClipArea(this_00);
            if (!bVar12) {
              fVar21 = Element::GetClientWidth(this_00);
              local_98.x = fVar21;
              fVar21 = Element::GetScrollWidth(this_00);
              if (fVar21 + -0.5 <= local_98.x) {
                fVar21 = Element::GetClientHeight(this_00);
                local_98.x = fVar21;
                fVar21 = Element::GetScrollHeight(this_00);
                bVar20 = fVar21 + -0.5 <= local_98.x;
                goto LAB_00298ed1;
              }
            }
            bVar20 = false;
          }
LAB_00298ed1:
          uVar13 = (undefined4)uVar15;
          if (local_80 == (ClipMaskGeometryList *)0x0) {
            bVar12 = false;
          }
          else {
            local_98.x = (float)uVar18;
            this_01 = Element::GetTransformState(this_00);
            if (this_01 == (TransformState *)0x0) {
              pMVar11 = (Matrix4f *)0x0;
            }
            else {
              pMVar11 = TransformState::GetTransform(this_01);
            }
            uVar1 = (pCVar10->rare).border_top_left_radius;
            uVar2 = (pCVar10->rare).border_top_right_radius;
            uVar3 = (pCVar10->rare).border_bottom_right_radius;
            uVar4 = (pCVar10->rare).border_bottom_left_radius;
            auVar23._0_2_ = -(ushort)(0 < (short)uVar1);
            auVar23._2_2_ = -(ushort)(0 < (short)uVar1);
            auVar23._4_2_ = -(ushort)(0 < (short)uVar2);
            auVar23._6_2_ = -(ushort)(0 < (short)uVar2);
            auVar23._8_2_ = -(ushort)(0 < (short)uVar3);
            auVar23._10_2_ = -(ushort)(0 < (short)uVar3);
            auVar23._12_2_ = -(ushort)(0 < (short)uVar4);
            auVar23._14_2_ = -(ushort)(0 < (short)uVar4);
            uVar14 = movmskps(uVar13,auVar23);
            uVar15 = (ulong)uVar14;
            if ((uVar14 != 0) || (pMVar11 != (Matrix4f *)0x0 && !bVar20)) {
              local_88 = pMVar11;
              this_02 = Element::GetElementBackgroundBorder(this_00);
              local_70 = (Vector2Type)
                         ElementBackgroundBorder::GetClipGeometry(this_02,this_00,local_bc);
              this = local_80;
              pCVar6 = (local_80->
                       super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pCVar7 = (local_80->
                       super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              element_region.p0 = Element::GetAbsoluteOffset(this_00,Border);
              Vector2<float>::Round(&element_region.p0);
              element_region.p0.x = (float)((uint)(pCVar6 != pCVar7) * 2);
              element_region.p1 = local_70;
              ::std::vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::
              emplace_back<Rml::ClipMaskGeometry>(this,(ClipMaskGeometry *)&element_region);
              pMVar11 = local_88;
            }
            bVar12 = pMVar11 != (Matrix4f *)0x0;
            uVar18 = (ulong)local_98 & 0xffffffff;
          }
          if (!bVar20 && !bVar12) {
            element_region.p0 = Element::GetAbsoluteOffset(this_00,local_bc);
            local_98 = Vector2<float>::Round((Vector2<float> *)&element_region);
            uVar15 = 0;
            Element::GetRenderBox((RenderBox *)&element_region,this_00,local_bc,0);
            fVar22 = element_region.p0.x;
            fVar21 = element_region.p0.y;
            element_region.p0 = local_98;
            element_region.p1.y = fVar21 + local_98.y;
            element_region.p1.x = fVar22 + local_98.x;
            local_a8 = Rectangle<float>::IntersectIfValid
                                 ((Rectangle<float> *)&element_region,local_a8);
            if ((char)uVar18 == '\0') goto LAB_0029904b;
            break;
          }
        }
        if ((char)uVar18 != '\0') break;
      }
      else {
        if (bVar5 == 0xff) {
          uVar18 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
          uVar9 = 0;
          goto LAB_00298e2b;
        }
        uVar18 = 0;
        uVar9 = 0;
        if ('\0' < (char)bVar5) {
          uVar9 = (uint)bVar5;
        }
        if (bVar5 != 0xfe) goto LAB_00298e2b;
        uVar15 = CONCAT71(uVar17,uVar19 != 0);
        if (uVar19 == 0 || bVar20 && force_clip_self) {
          bVar12 = true;
          uVar18 = 0;
          goto LAB_00298e46;
        }
      }
LAB_0029904b:
      bVar20 = uVar19 != 0 &&
               ((undefined1  [96])CVar8 & (undefined1  [96])0x3c00) != (undefined1  [96])0x0;
      uVar16 = CONCAT71((int7)(uVar15 >> 8),bVar20);
      uVar19 = uVar19 - bVar20;
      if ((int)uVar19 <= (int)uVar9) {
        uVar19 = uVar9;
      }
    }
    if ((local_a8.p0.x <= local_a8.p1.x) && (local_a8.p0.y <= local_a8.p1.y)) {
      Math::SnapToPixelGrid(&local_a8);
      RVar25 = Rectangle::operator_cast_to_Rectangle(&local_a8);
      local_78->p0 = RVar25.p0;
      local_78->p1 = RVar25.p1;
    }
    bVar24 = -(local_a8.p0.y <= local_a8.p1.y && local_a8.p0.x <= local_a8.p1.x);
  }
  return (bool)(bVar24 & 1);
}

Assistant:

bool ElementUtilities::GetClippingRegion(Element* element, Rectanglei& out_clip_region, ClipMaskGeometryList* out_clip_mask_list,
	bool force_clip_self)
{
	using Style::Clip;
	Clip target_element_clip = element->GetComputedValues().clip();
	if (target_element_clip == Clip::Type::None && !force_clip_self)
		return false;

	int num_ignored_clips = target_element_clip.GetNumber();

	// Search through the element's ancestors, finding all elements that clip their overflow and have overflow to clip.
	// For each that we find, we combine their clipping region with the existing clipping region, and so build up a
	// complete clipping region for the element.
	Element* clipping_element = (force_clip_self ? element : element->GetOffsetParent());

	Rectanglef clip_region = Rectanglef::MakeInvalid();

	while (clipping_element)
	{
		const bool force_clip_current_element = (force_clip_self && clipping_element == element);
		const ComputedValues& clip_computed = clipping_element->GetComputedValues();
		const bool clip_enabled = (clip_computed.overflow_x() != Style::Overflow::Visible || clip_computed.overflow_y() != Style::Overflow::Visible);
		const bool clip_always = (clip_computed.clip() == Clip::Type::Always);
		const bool clip_none = (clip_computed.clip() == Clip::Type::None);
		const int clip_number = clip_computed.clip().GetNumber();

		// Merge the existing clip region with the current clip region, unless we are ignoring clip regions.
		if (((clip_always || clip_enabled) && num_ignored_clips == 0) || force_clip_current_element)
		{
			const BoxArea clip_area = (force_clip_current_element ? BoxArea::Border : clipping_element->GetClipArea());
			const bool has_clipping_content =
				(clip_always || force_clip_current_element || clipping_element->GetClientWidth() < clipping_element->GetScrollWidth() - 0.5f ||
					clipping_element->GetClientHeight() < clipping_element->GetScrollHeight() - 0.5f);
			bool disable_scissor_clipping = false;

			if (out_clip_mask_list)
			{
				const TransformState* transform_state = clipping_element->GetTransformState();
				const Matrix4f* transform = (transform_state ? transform_state->GetTransform() : nullptr);
				const bool has_border_radius = (clip_computed.border_top_left_radius() > 0.f || clip_computed.border_top_right_radius() > 0.f ||
					clip_computed.border_bottom_right_radius() > 0.f || clip_computed.border_bottom_left_radius() > 0.f);

				// If the element has border-radius we always use a clip mask, since we can't easily predict if content is located on the curved
				// region to be clipped. If the element has a transform we only use a clip mask when the content clips.
				if (has_border_radius || (transform && has_clipping_content))
				{
					Geometry* clip_geometry = clipping_element->GetElementBackgroundBorder()->GetClipGeometry(clipping_element, clip_area);
					const ClipMaskOperation clip_operation = (out_clip_mask_list->empty() ? ClipMaskOperation::Set : ClipMaskOperation::Intersect);
					const Vector2f absolute_offset = clipping_element->GetAbsoluteOffset(BoxArea::Border).Round();
					out_clip_mask_list->push_back(ClipMaskGeometry{clip_operation, clip_geometry, absolute_offset, transform});
				}

				// If we only have border-radius then we add this element to the scissor region as well as the clip mask. This may help with e.g.
				// culling text render calls. However, when we have a transform, the element cannot be added to the scissor region since its geometry
				// may be projected entirely elsewhere.
				if (transform)
					disable_scissor_clipping = true;
			}

			if (has_clipping_content && !disable_scissor_clipping)
			{
				// Shrink the scissor region to the element's client area.
				Vector2f element_offset = clipping_element->GetAbsoluteOffset(clip_area).Round();
				Vector2f element_size = clipping_element->GetRenderBox(clip_area).GetFillSize();
				Rectanglef element_region = Rectanglef::FromPositionSize(element_offset, element_size);

				clip_region = element_region.IntersectIfValid(clip_region);
			}
		}

		// If this region is meant to clip and we're skipping regions, update the counter.
		if (num_ignored_clips > 0 && clip_enabled)
			num_ignored_clips--;

		// Inherit how many clip regions this ancestor ignores.
		num_ignored_clips = Math::Max(num_ignored_clips, clip_number);

		// If this region ignores all clipping regions, then we do too.
		if (clip_none)
			break;

		// Climb the tree to this region's parent.
		clipping_element = clipping_element->GetOffsetParent();
	}

	if (clip_region.Valid())
	{
		Math::SnapToPixelGrid(clip_region);
		out_clip_region = Rectanglei(clip_region);
	}

	return clip_region.Valid();
}